

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

int eval_arg<int>(char *s,int min,int max)

{
  byte bVar1;
  long *plVar2;
  runtime_error *this;
  allocator<char> local_1c1;
  string local_1c0 [32];
  istringstream local_1a0 [8];
  istringstream in;
  int local_1c;
  int local_18;
  int value;
  int max_local;
  int min_local;
  char *s_local;
  
  local_18 = max;
  value = min;
  _max_local = s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,s,&local_1c1);
  std::__cxx11::istringstream::istringstream(local_1a0,local_1c0,_S_in);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  plVar2 = (long *)std::istream::operator>>((istream *)local_1a0,&local_1c);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((((bVar1 & 1) == 0) && (value <= local_1c)) && (local_1c <= local_18)) {
    std::__cxx11::istringstream::~istringstream(local_1a0);
    return local_1c;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid value");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T eval_arg(const char* s, T min, T max)
{
    T value;
    std::istringstream in{s};

    if (!(in >> value) || value < min || value > max)
        throw std::runtime_error("invalid value");

    return value;
}